

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O1

bool QPpmHandler::canRead(QIODevice *device,QByteArray *subType)

{
  bool bVar1;
  long lVar2;
  QPpmHandler *this;
  ulong uVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char head [2];
  undefined2 local_12;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    this = (QPpmHandler *)QtPrivateLogging::lcImageIo();
    if ((this->state & 0x100) != Ready) {
      canRead(this);
    }
    bVar1 = false;
    goto LAB_002b937f;
  }
  local_12 = 0xaaaa;
  lVar2 = QIODevice::peek((char *)device,(longlong)&local_12);
  bVar1 = false;
  if ((lVar2 != 2) || (bVar1 = false, (char)local_12 != 'P')) goto LAB_002b937f;
  uVar3 = (ulong)local_12._1_1_;
  bVar1 = false;
  if (0x36 < uVar3) goto LAB_002b937f;
  if ((0x12000000000000U >> (uVar3 & 0x3f) & 1) == 0) {
    if ((0x24000000000000U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x48000000000000U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_002b937f;
      if (subType != (QByteArray *)0x0) {
        pcVar4 = "ppm";
        goto LAB_002b9375;
      }
    }
    else if (subType != (QByteArray *)0x0) {
      pcVar4 = "pgm";
      goto LAB_002b9375;
    }
  }
  else if (subType != (QByteArray *)0x0) {
    pcVar4 = "pbm";
LAB_002b9375:
    QByteArray::operator=(subType,pcVar4);
  }
  bVar1 = true;
LAB_002b937f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QPpmHandler::canRead(QIODevice *device, QByteArray *subType)
{
    if (!device) {
        qCWarning(lcImageIo, "QPpmHandler::canRead() called with no device");
        return false;
    }

    char head[2];
    if (device->peek(head, sizeof(head)) != sizeof(head))
        return false;

    if (head[0] != 'P')
        return false;

    if (head[1] == '1' || head[1] == '4') {
        if (subType)
            *subType = "pbm";
    } else if (head[1] == '2' || head[1] == '5') {
        if (subType)
            *subType = "pgm";
    } else if (head[1] == '3' || head[1] == '6') {
        if (subType)
            *subType = "ppm";
    } else {
        return false;
    }
    return true;
}